

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  long lVar2;
  undefined8 in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffff2c;
  RepeatedPtrFieldBase *in_stack_ffffffffffffff30;
  
  if ((*(long *)(in_RDI + 0x10) == 0) || (**(int **)(in_RDI + 0x10) == *(int *)(in_RDI + 0xc))) {
    Reserve(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  lVar2 = *(long *)(in_RDI + 0x10);
  iVar1 = **(int **)(in_RDI + 0x10);
  **(int **)(in_RDI + 0x10) = iVar1 + 1;
  *(undefined8 *)(lVar2 + 8 + (long)iVar1 * 8) = in_RSI;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetArena(value) == NULL)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}